

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifestAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TypedAttribute<Imf_3_3::CompressedIDManifest>::readValueFrom
          (TypedAttribute<Imf_3_3::CompressedIDManifest> *this,IStream *is,int size,int version)

{
  char *text;
  void *pvVar1;
  int in_EDX;
  IStream *in_RDI;
  char *input;
  uint64_t uncompressedDataSize;
  uint64_t *in_stack_ffffffffffffffb8;
  size_type local_30;
  
  if (in_EDX < 8) {
    text = (char *)__cxa_allocate_exception(0x48);
    Iex_3_3::InputExc::InputExc((InputExc *)in_RDI,text);
    __cxa_throw(text,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
  }
  *(int *)&in_RDI->_fileName = in_EDX + -8;
  if ((in_RDI->_fileName).field_2._M_allocated_capacity != 0) {
    free((void *)(in_RDI->_fileName).field_2._M_allocated_capacity);
    (in_RDI->_fileName).field_2._M_allocated_capacity = 0;
  }
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RDI,in_stack_ffffffffffffffb8);
  (in_RDI->_fileName)._M_string_length = local_30;
  pvVar1 = malloc((long)in_EDX - 8);
  (in_RDI->_fileName).field_2._M_allocated_capacity = (size_type)pvVar1;
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_RDI,(char *)in_stack_ffffffffffffffb8,0);
  return;
}

Assistant:

IMF_EXPORT void
IDManifestAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{

    if (size < static_cast<int> (sizeof (uint64_t)))
    {
        throw IEX_NAMESPACE::InputExc (
            "Invalid size field reading idmanifest attribute");
    }
    _value._compressedDataSize = size - sizeof (uint64_t);

    if (_value._data)
    {
        // if attribute is reallocated , free up previous memory
        free (static_cast<void*> (_value._data));
        _value._data = nullptr;
    }

    uint64_t uncompressedDataSize;
    //
    // first eight bytes: data size once data is uncompressed
    //
    Xdr::read<StreamIO> (is, uncompressedDataSize);

    _value._uncompressedDataSize = uncompressedDataSize;

    //
    // allocate memory for compressed storage and read data
    //
    _value._data =
        static_cast<unsigned char*> (malloc (size - sizeof (uint64_t)));
    char* input = (char*) _value._data;
    Xdr::read<StreamIO> (is, input, _value._compressedDataSize);
}